

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_file_name_posix.cpp
# Opt level: O3

string * pstore::process_file_name_abi_cxx11_(void)

{
  errno_erc erc;
  __pid_t _Var1;
  ostream *poVar2;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  string *in_RDI;
  array<char,_256UL> *__buf;
  ulong new_elements;
  string path;
  small_vector<char,_256UL> buffer;
  ostringstream str;
  long *local_308;
  long local_300;
  long local_2f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  small_vector<char,_256UL> local_2c8;
  extent_type<_1L> local_1a0 [14];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"/proc/",6);
  _Var1 = getpid();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,_Var1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/exe",4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  memset(&local_2c8,0,0x120);
  local_2c8.buffer_ = local_2c8.small_buffer_._M_elems;
  small_vector<char,_256UL>::resize(&local_2c8,0x100);
  __buf = (array<char,_256UL> *)local_2c8.buffer_;
  gsl::details::extent_type<-1L>::extent_type(local_1a0,local_2c8.elements_);
  if (-1 < local_1a0[0].size_) {
    new_elements = 0x100;
    do {
      uVar3 = readlink((char *)local_308,__buf->_M_elems,local_1a0[0].size_);
      if ((long)uVar3 < 0) {
        piVar4 = __errno_location();
        erc.err_ = *piVar4;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"readlink() of \"",0xf);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a0,(char *)local_308,local_300);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" failed",8);
        std::__cxx11::stringbuf::str();
        raise<pstore::errno_erc,std::__cxx11::string>(erc,&local_2e8);
      }
      uVar5 = (new_elements >> 1) + new_elements;
      new_elements = uVar5;
      if (uVar5 < uVar3) {
        new_elements = uVar3;
      }
      if (uVar3 == 0) {
        if (0xffffff < uVar5) {
LAB_00134ba1:
          raise<pstore::error_code>(unknown_process_path);
        }
      }
      else if ((0xffffff < new_elements) || (uVar3 < local_2c8.elements_)) {
        if (new_elements < 0x1000000) {
          (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
          std::__cxx11::string::_M_construct<char_const*>();
          if (local_2c8.big_buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2c8.big_buffer_.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2c8.big_buffer_.
                                  super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_2c8.big_buffer_.
                                  super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_308 != local_2f8) {
            operator_delete(local_308,local_2f8[0] + 1);
          }
          return in_RDI;
        }
        goto LAB_00134ba1;
      }
      small_vector<char,_256UL>::resize(&local_2c8,new_elements);
      __buf = (array<char,_256UL> *)local_2c8.buffer_;
      gsl::details::extent_type<-1L>::extent_type(local_1a0,local_2c8.elements_);
    } while (-1 < local_1a0[0].size_);
  }
  assert_failed("buffer_size >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/process_file_name_posix.cpp"
                ,0x75);
}

Assistant:

std::string process_file_name () {
        std::string const path = link_path ();
        auto read_link = [&path] (gsl::span<char> const buffer) {
            auto const buffer_size = buffer.size ();
            PSTORE_ASSERT (buffer_size >= 0);
            ssize_t const num_chars = ::readlink (path.c_str (), buffer.data (),
                                                  clamp (static_cast<std::size_t> (buffer_size),
                                                         std::size_t{0}, std::size_t{SSIZE_MAX}));
            if (num_chars < 0) {
                int const error = errno;
                std::ostringstream str;
                str << "readlink() of \"" << path << "\" failed";
                raise (errno_erc{error}, str.str ());
            }
            PSTORE_STATIC_ASSERT (std::numeric_limits<std::size_t>::max () >=
                                  unsigned_cast (std::numeric_limits<ssize_t>::max ()));
            return static_cast<std::size_t> (num_chars);
        };

        small_vector<char> buffer;
        std::size_t const length = process_file_name (read_link, buffer);
        return {buffer.data (), length};
    }